

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySet.h
# Opt level: O0

bool __thiscall
cmInstallRuntimeDependencySet::AddBundleExecutable
          (cmInstallRuntimeDependencySet *this,
          cmInstallImportedRuntimeArtifactsGenerator *bundleExecutable)

{
  bool bVar1;
  unique_ptr<cmInstallRuntimeDependencySet::ImportedTargetItem,_std::default_delete<cmInstallRuntimeDependencySet::ImportedTargetItem>_>
  local_28;
  unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
  local_20;
  cmInstallImportedRuntimeArtifactsGenerator *local_18;
  cmInstallImportedRuntimeArtifactsGenerator *bundleExecutable_local;
  cmInstallRuntimeDependencySet *this_local;
  
  local_18 = bundleExecutable;
  bundleExecutable_local = (cmInstallImportedRuntimeArtifactsGenerator *)this;
  std::
  make_unique<cmInstallRuntimeDependencySet::ImportedTargetItem,cmInstallImportedRuntimeArtifactsGenerator*&>
            ((cmInstallImportedRuntimeArtifactsGenerator **)&local_28);
  std::
  unique_ptr<cmInstallRuntimeDependencySet::Item,std::default_delete<cmInstallRuntimeDependencySet::Item>>
  ::
  unique_ptr<cmInstallRuntimeDependencySet::ImportedTargetItem,std::default_delete<cmInstallRuntimeDependencySet::ImportedTargetItem>,void>
            ((unique_ptr<cmInstallRuntimeDependencySet::Item,std::default_delete<cmInstallRuntimeDependencySet::Item>>
              *)&local_20,&local_28);
  bVar1 = AddBundleExecutable(this,&local_20);
  std::
  unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
  ::~unique_ptr(&local_20);
  std::
  unique_ptr<cmInstallRuntimeDependencySet::ImportedTargetItem,_std::default_delete<cmInstallRuntimeDependencySet::ImportedTargetItem>_>
  ::~unique_ptr(&local_28);
  return bVar1;
}

Assistant:

bool AddBundleExecutable(
    cmInstallImportedRuntimeArtifactsGenerator* bundleExecutable)
  {
    return this->AddBundleExecutable(
      cm::make_unique<ImportedTargetItem>(bundleExecutable));
  }